

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O0

bool __thiscall cmCTestSVN::LoadRevisions(cmCTestSVN *this,SVNInfo *svninfo)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  undefined1 local_320 [8];
  OutputLogger err;
  LogParser out;
  value_type local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 local_e0 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> svn_log;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38 [8];
  string revs;
  SVNInfo *svninfo_local;
  cmCTestSVN *this_local;
  
  revs.field_2._8_8_ = svninfo;
  std::__cxx11::string::string(local_38);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  iVar2 = atoi(pcVar4);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  iVar3 = atoi(pcVar4);
  if (iVar2 < iVar3) {
    std::operator+(&local_98,"-r",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (revs.field_2._8_8_ + 0x80));
    std::operator+(&local_78,&local_98,":");
    std::operator+(&local_58,&local_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (revs.field_2._8_8_ + 0xa0));
    std::__cxx11::string::operator=(local_38,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &svn_log.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,"-r",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (revs.field_2._8_8_ + 0xa0));
    std::__cxx11::string::operator=
              (local_38,(string *)
                        &svn_log.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &svn_log.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_e0);
  local_e8 = "log";
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_e0,&local_e8);
  local_f0 = "--xml";
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_e0,&local_f0);
  local_f8 = "-v";
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_e0,&local_f8);
  local_100 = (value_type)std::__cxx11::string::c_str();
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_e0,&local_100);
  out.CData.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ =
       std::__cxx11::string::c_str();
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_e0,
             (value_type *)
             &out.CData.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  LogParser::LogParser
            ((LogParser *)&err.super_LineParser.Separator,this,"log-out> ",
             (SVNInfo *)revs.field_2._8_8_);
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_320,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"log-err> "
            );
  bVar1 = RunSVNCommand(this,(vector<const_char_*,_std::allocator<const_char_*>_> *)local_e0,
                        (OutputParser *)&err.super_LineParser.Separator,(OutputParser *)local_320);
  cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)local_320);
  LogParser::~LogParser((LogParser *)&err.super_LineParser.Separator);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_e0);
  std::__cxx11::string::~string(local_38);
  return bVar1;
}

Assistant:

bool cmCTestSVN::LoadRevisions(SVNInfo& svninfo)
{
  // We are interested in every revision included in the update.
  std::string revs;
  if (atoi(svninfo.OldRevision.c_str()) < atoi(svninfo.NewRevision.c_str())) {
    revs = "-r" + svninfo.OldRevision + ":" + svninfo.NewRevision;
  } else {
    revs = "-r" + svninfo.NewRevision;
  }

  // Run "svn log" to get all global revisions of interest.
  std::vector<const char*> svn_log;
  svn_log.push_back("log");
  svn_log.push_back("--xml");
  svn_log.push_back("-v");
  svn_log.push_back(revs.c_str());
  svn_log.push_back(svninfo.LocalPath.c_str());
  LogParser out(this, "log-out> ", svninfo);
  OutputLogger err(this->Log, "log-err> ");
  return this->RunSVNCommand(svn_log, &out, &err);
}